

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_name_gen.cxx
# Opt level: O0

int __thiscall xray_re::xr_name_gen::init(xr_name_gen *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  xr_name_gen *pxVar4;
  byte in_DL;
  size_t size;
  bool mimic_gsc_local;
  char *pattern_local;
  xr_name_gen *this_local;
  
  sVar2 = strlen((char *)ctx);
  pcVar3 = (char *)operator_new__(sVar2 + 0x10);
  this->m_name = pcVar3;
  memcpy(this->m_name,ctx,sVar2 + 1);
  this->m_offset = (uint)sVar2;
  if ((in_DL & 1) == 0) {
    this->m_next_idx = 0;
    pxVar4 = (xr_name_gen *)this->m_name;
    uVar1 = this->m_offset;
    *(undefined4 *)((long)&pxVar4->m_name + (ulong)uVar1) = 0x30303030;
    *(undefined1 *)((long)&pxVar4->m_name + (ulong)uVar1 + 4) = 0;
  }
  else {
    this->m_next_idx = -1;
    pxVar4 = this;
  }
  return (int)pxVar4;
}

Assistant:

void xr_name_gen::init(const char* pattern, bool mimic_gsc)
{
	size_t size = std::strlen(pattern);
	m_name = new char[size + k_reserved];
	std::memcpy(m_name, pattern, size + 1);
	m_offset = unsigned(size & UINT_MAX);
	if (mimic_gsc) {
		m_next_idx = -1;
	} else {
		m_next_idx = 0;
		std::memcpy(&m_name[m_offset], "0000", 5);
	}
}